

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_resize(REF_INTERP ref_interp,REF_INT max)

{
  REF_BOOL *pRVar1;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  int local_2c;
  int local_28;
  REF_INT ref_realloc_init_i_2;
  REF_INT ref_realloc_init_i_1;
  REF_INT ref_realloc_init_i;
  REF_INT old;
  REF_INT max_local;
  REF_INTERP ref_interp_local;
  
  local_2c = ref_interp->max;
  fflush(_stdout);
  if (0 < max) {
    pRVar1 = (REF_BOOL *)realloc(ref_interp->agent_hired,(long)max << 2);
    ref_interp->agent_hired = pRVar1;
  }
  ref_realloc_init_i_2 = local_2c;
  if (ref_interp->agent_hired == (REF_BOOL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xd1,
           "ref_interp_resize","realloc ref_interp->agent_hired NULL");
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)max,(long)max,4,
           (long)max << 2);
    ref_interp_local._4_4_ = 2;
  }
  else {
    for (; ref_realloc_init_i_2 < max; ref_realloc_init_i_2 = ref_realloc_init_i_2 + 1) {
      ref_interp->agent_hired[ref_realloc_init_i_2] = 0;
    }
    fflush(_stdout);
    if (0 < max) {
      pRVar2 = (REF_INT *)realloc(ref_interp->cell,(long)max << 2);
      ref_interp->cell = pRVar2;
    }
    local_28 = local_2c;
    if (ref_interp->cell == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xd2
             ,"ref_interp_resize","realloc ref_interp->cell NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)max,(long)max,4
             ,(long)max << 2);
      ref_interp_local._4_4_ = 2;
    }
    else {
      for (; local_28 < max; local_28 = local_28 + 1) {
        ref_interp->cell[local_28] = -1;
      }
      fflush(_stdout);
      if (0 < max) {
        pRVar2 = (REF_INT *)realloc(ref_interp->part,(long)max << 2);
        ref_interp->part = pRVar2;
      }
      if (ref_interp->part == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xd3,"ref_interp_resize","realloc ref_interp->part NULL");
        printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)max,(long)max
               ,4,(long)max << 2);
        ref_interp_local._4_4_ = 2;
      }
      else {
        for (; local_2c < max; local_2c = local_2c + 1) {
          ref_interp->part[local_2c] = -1;
        }
        fflush(_stdout);
        if (0 < max * 4) {
          pRVar3 = (REF_DBL *)realloc(ref_interp->bary,(long)(max << 2) << 3);
          ref_interp->bary = pRVar3;
        }
        if (ref_interp->bary == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xd4,"ref_interp_resize","realloc ref_interp->bary NULL");
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)(max << 2),
                 (long)(max << 2),8,(long)(max << 2) << 3);
          ref_interp_local._4_4_ = 2;
        }
        else {
          ref_interp->max = max;
          ref_interp_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_resize(REF_INTERP ref_interp, REF_INT max) {
  REF_INT old = ref_interp_max(ref_interp);

  ref_realloc_init(ref_interp->agent_hired, old, max, REF_BOOL, REF_FALSE);
  ref_realloc_init(ref_interp->cell, old, max, REF_INT, REF_EMPTY);
  ref_realloc_init(ref_interp->part, old, max, REF_INT, REF_EMPTY);
  ref_realloc(ref_interp->bary, 4 * max, REF_DBL);

  ref_interp_max(ref_interp) = max;

  return REF_SUCCESS;
}